

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O2

int X509_NAME_ENTRY_set_data(X509_NAME_ENTRY *ne,int type,uchar *bytes,int len)

{
  int iVar1;
  size_t sVar2;
  ASN1_STRING *pAVar3;
  int in_register_0000000c;
  uint uVar4;
  
  sVar2 = CONCAT44(in_register_0000000c,len);
  uVar4 = 0;
  if ((ne != (X509_NAME_ENTRY *)0x0) && (bytes != (uchar *)0x0 || sVar2 == 0)) {
    if (((uint)type >> 0xc & 1) == 0 || type < 1) {
      if (in_register_0000000c < 0) {
        sVar2 = strlen((char *)bytes);
      }
      iVar1 = ASN1_STRING_set(ne->value,bytes,(int)sVar2);
      uVar4 = 0;
      if (iVar1 != 0) {
        uVar4 = 1;
        if (type != -1) {
          ne->value->type = type;
        }
      }
    }
    else {
      iVar1 = OBJ_obj2nid(ne->object);
      pAVar3 = ASN1_STRING_set_by_NID(&ne->value,bytes,len,type,iVar1);
      uVar4 = (uint)(pAVar3 != (ASN1_STRING *)0x0);
    }
  }
  return uVar4;
}

Assistant:

int X509_NAME_ENTRY_set_data(X509_NAME_ENTRY *ne, int type,
                             const unsigned char *bytes, ossl_ssize_t len) {
  if ((ne == NULL) || ((bytes == NULL) && (len != 0))) {
    return 0;
  }
  if ((type > 0) && (type & MBSTRING_FLAG)) {
    return ASN1_STRING_set_by_NID(&ne->value, bytes, len, type,
                                  OBJ_obj2nid(ne->object))
               ? 1
               : 0;
  }
  if (len < 0) {
    len = strlen((const char *)bytes);
  }
  if (!ASN1_STRING_set(ne->value, bytes, len)) {
    return 0;
  }
  if (type != V_ASN1_UNDEF) {
    ne->value->type = type;
  }
  return 1;
}